

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptAsyncFunction.h
# Opt level: O1

void __thiscall
Js::JavascriptAsyncSpawnStepFunction::JavascriptAsyncSpawnStepFunction
          (JavascriptAsyncSpawnStepFunction *this,DynamicType *type,FunctionInfo *functionInfo,
          JavascriptGenerator *generator,Var argument,Var resolve,Var reject,bool isReject)

{
  RuntimeFunction::RuntimeFunction(&this->super_RuntimeFunction,type,functionInfo);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_0150ecc8;
  Memory::Recycler::WBSetBit((char *)&this->generator);
  (this->generator).ptr = generator;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->generator);
  Memory::Recycler::WBSetBit((char *)&this->reject);
  (this->reject).ptr = reject;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->reject);
  Memory::Recycler::WBSetBit((char *)&this->resolve);
  (this->resolve).ptr = resolve;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->resolve);
  this->isReject = isReject;
  Memory::Recycler::WBSetBit((char *)&this->argument);
  (this->argument).ptr = argument;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->argument);
  return;
}

Assistant:

JavascriptAsyncSpawnStepFunction(
        DynamicType* type,
        FunctionInfo* functionInfo,
        JavascriptGenerator* generator,
        Var argument,
        Var resolve = nullptr,
        Var reject = nullptr,
        bool isReject = false) :
            RuntimeFunction(type, functionInfo),
            generator(generator),
            argument(argument),
            resolve(resolve),
            reject(reject),
            isReject(isReject) {}